

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::addFrameConstraint
          (InverseKinematics *this,string *frameName,Transform *constraintValue)

{
  missingIpoptErrorReport();
  return false;
}

Assistant:

bool InverseKinematics::addFrameConstraint(const std::string& frameName, const iDynTree::Transform& constraintValue)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        return IK_PIMPL(m_pimpl)->addFrameConstraint(internal::kinematics::TransformConstraint::fullTransformConstraint(frameName, constraintValue));
#else
        return missingIpoptErrorReport();
#endif
    }